

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall Spaghetti<UFPC>::PerformLabeling(Spaghetti<UFPC> *this)

{
  char cVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int local_190;
  Mat local_90 [96];
  long lVar23;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar16 = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar17 = (ulong)(int)uVar2;
  cv::Mat::Mat(local_90,**(int **)&pMVar3->field_0x40,(*(int **)&pMVar3->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar46 = uVar16 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar7 = (uint *)operator_new__((ulong)(((*(int *)&pMVar3->field_0xc -
                                           (*(int *)&pMVar3->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar3->field_0x8 -
                                           (*(int *)&pMVar3->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  UFPC::P_ = puVar7;
  *puVar7 = 0;
  UFPC::length_ = 1;
  lVar45 = *(long *)&pMVar3->field_0x10;
  if (uVar16 == 1) {
    lVar48 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar15 = 0;
    iVar14 = (int)(uVar17 - 2);
    if (2 < (int)uVar2) {
      uVar6 = 0xfffffffe;
      uVar15 = 0;
LAB_0013a4c1:
      if (*(char *)(lVar45 + (int)uVar15) == '\0') goto LAB_0013a4f1;
      cVar1 = *(char *)(lVar45 + 3 + (long)(int)uVar6);
      puVar7[UFPC::length_] = UFPC::length_;
      uVar6 = UFPC::length_ + 1;
      *(uint *)(lVar48 + (long)(int)uVar15 * 4) = UFPC::length_;
      UFPC::length_ = uVar6;
      uVar6 = uVar15;
      if (cVar1 == '\0') goto LAB_0013a570;
      while (uVar6 = uVar15 + 2, (int)uVar6 < iVar14) {
        uVar34 = (long)(int)uVar15;
        uVar15 = uVar6;
        while (*(char *)(lVar45 + 2 + uVar34) != '\0') {
          if (*(char *)(lVar45 + 3 + uVar34) == '\0') {
            uVar12 = *(undefined4 *)(lVar48 + uVar34 * 4);
            lVar38 = uVar34 + 2;
            goto LAB_0013a56c;
          }
          *(undefined4 *)(lVar48 + 8 + uVar34 * 4) = *(undefined4 *)(lVar48 + uVar34 * 4);
          uVar35 = uVar34 + 2;
          lVar38 = uVar34 + 4;
          uVar15 = uVar15 + 2;
          uVar34 = uVar35;
          if ((long)(uVar17 - 2) <= lVar38) goto LAB_0013a8e7;
        }
LAB_0013a4f1:
        lVar38 = (long)(int)uVar15;
        if (*(char *)(lVar45 + 1 + lVar38) == '\0') goto LAB_0013a557;
        puVar7[UFPC::length_] = UFPC::length_;
        uVar6 = UFPC::length_ + 1;
        *(uint *)(lVar48 + lVar38 * 4) = UFPC::length_;
        UFPC::length_ = uVar6;
      }
      uVar35 = (ulong)uVar15;
      uVar15 = uVar6;
LAB_0013a8e7:
      lVar38 = (long)(int)uVar15;
      if (iVar14 < (int)uVar15) {
        if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013a8fa;
      }
      else if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013a91b;
      *(undefined4 *)(lVar48 + lVar38 * 4) = *(undefined4 *)(lVar48 + (long)(int)uVar35 * 4);
      goto LAB_0013ee71;
    }
LAB_0013a57f:
    lVar38 = (long)(int)uVar15;
    if (iVar14 < (int)uVar15) {
      if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_0013a8fa:
        *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
        goto LAB_0013ee71;
      }
    }
    else if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_0013a91b:
      lVar38 = (long)(int)uVar15;
      if (*(char *)(lVar45 + 1 + lVar38) == '\0') {
        *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
      }
      else {
        puVar7[UFPC::length_] = UFPC::length_;
        uVar15 = UFPC::length_ + 1;
        *(uint *)(lVar48 + lVar38 * 4) = UFPC::length_;
        UFPC::length_ = uVar15;
      }
      goto LAB_0013ee71;
    }
    puVar7[UFPC::length_] = UFPC::length_;
    uVar15 = UFPC::length_ + 1;
    *(uint *)(lVar48 + lVar38 * 4) = UFPC::length_;
    UFPC::length_ = uVar15;
    goto LAB_0013ee71;
  }
  lVar38 = **(long **)&pMVar3->field_0x48;
  lVar48 = lVar45 + lVar38;
  lVar37 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar34 = 0;
  local_190 = (int)(uVar17 - 2);
  if ((int)uVar2 < 3) {
LAB_0013a7b7:
    uVar15 = (uint)uVar34;
    lVar38 = (long)(int)uVar15;
    if ((int)uVar15 <= local_190) {
      if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0')) {
LAB_0013a961:
        lVar38 = (long)(int)uVar34;
        if (*(char *)(lVar38 + 1 + lVar45) == '\0') {
          if (*(char *)(lVar48 + 1 + lVar38) == '\0') {
            *(undefined4 *)(lVar37 + lVar38 * 4) = 0;
          }
          else {
            puVar7[UFPC::length_] = UFPC::length_;
            uVar15 = UFPC::length_ + 1;
            *(uint *)(lVar37 + lVar38 * 4) = UFPC::length_;
            UFPC::length_ = uVar15;
          }
        }
        else {
          puVar7[UFPC::length_] = UFPC::length_;
          uVar15 = UFPC::length_ + 1;
          *(uint *)(lVar37 + lVar38 * 4) = UFPC::length_;
          UFPC::length_ = uVar15;
        }
      }
      else {
LAB_0013a861:
        puVar7[UFPC::length_] = UFPC::length_;
        uVar6 = UFPC::length_ + 1;
        *(uint *)(lVar37 + (long)(int)uVar15 * 4) = UFPC::length_;
        UFPC::length_ = uVar6;
      }
      goto LAB_0013a988;
    }
    if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0'))
    goto LAB_0013a80d;
LAB_0013a89e:
    puVar7[UFPC::length_] = UFPC::length_;
    uVar15 = UFPC::length_ + 1;
    *(uint *)(lVar37 + lVar38 * 4) = UFPC::length_;
    UFPC::length_ = uVar15;
  }
  else {
    uVar34 = 0;
LAB_0013a5e4:
    if ((*(char *)(lVar45 + (int)uVar34) == '\0') && (*(char *)(lVar48 + (int)uVar34) == '\0'))
    goto LAB_0013a608;
LAB_0013a767:
    cVar1 = *(char *)(lVar45 + 1 + (long)(int)uVar34);
    puVar7[UFPC::length_] = UFPC::length_;
    uVar15 = UFPC::length_ + 1;
    *(uint *)(lVar37 + (long)(int)uVar34 * 4) = UFPC::length_;
    UFPC::length_ = uVar15;
    if (cVar1 != '\0') goto LAB_0013a650;
LAB_0013a680:
    iVar14 = (int)uVar34;
    uVar15 = iVar14 + 2;
    if ((int)uVar15 < local_190) {
      lVar40 = (long)iVar14;
      lVar24 = lVar40 + 2;
      lVar11 = lVar37 + lVar40 * 4;
      lVar49 = lVar45 + lVar38 + 2 + lVar40;
      lVar33 = lVar45 + 2 + lVar40;
      lVar40 = lVar40 << 0x20;
      lVar43 = 0;
      while( true ) {
        if (*(char *)(lVar33 + lVar43) != '\0') {
          uVar34 = lVar24 + lVar43 & 0xffffffff;
          if (*(char *)(lVar48 + 1 + (lVar40 >> 0x20)) != '\0') goto LAB_0013a66c;
          goto LAB_0013a767;
        }
        if (*(char *)(lVar49 + lVar43) == '\0') {
          uVar34 = (ulong)(uint)((int)lVar24 + (int)lVar43);
          goto LAB_0013a608;
        }
        if (*(char *)(lVar33 + 1 + lVar43) != '\0') break;
        if (*(char *)(lVar49 + -1 + lVar43) == '\0') {
          puVar7[UFPC::length_] = UFPC::length_;
          uVar15 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
        }
        else {
          uVar15 = *(uint *)(lVar11 + lVar43 * 4);
        }
        *(uint *)(lVar11 + 8 + lVar43 * 4) = uVar15;
        lVar40 = lVar40 + 0x200000000;
        lVar36 = lVar24 + lVar43;
        lVar43 = lVar43 + 2;
        if ((long)(uVar17 - 2) <= lVar36 + 2) {
          uVar15 = iVar14 + (int)lVar43 + 2;
          iVar14 = iVar14 + (int)lVar43;
          goto LAB_0013a7f0;
        }
      }
      uVar35 = lVar24 + lVar43;
      if (*(char *)(lVar43 + -1 + lVar49) == '\0') {
        uVar32 = (ulong)UFPC::length_;
        puVar7[uVar32] = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      else {
        uVar32 = (ulong)*(uint *)(lVar11 + lVar43 * 4);
      }
      uVar34 = uVar35 & 0xffffffff;
      while( true ) {
        *(int *)(lVar37 + uVar35 * 4) = (int)uVar32;
LAB_0013a650:
        while( true ) {
          lVar24 = (long)(int)uVar34;
          uVar34 = lVar24 + 2;
          if (local_190 <= (int)uVar34) {
            if (local_190 < (int)uVar34) {
              if (*(char *)(lVar45 + uVar34) == '\0') {
                if (*(char *)(lVar48 + uVar34) == '\0') {
                  *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = 0;
                }
                else {
                  *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = *(undefined4 *)(lVar37 + lVar24 * 4);
                }
              }
              else {
                *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = *(undefined4 *)(lVar37 + lVar24 * 4);
              }
              goto LAB_0013a988;
            }
            if ((*(char *)(lVar45 + uVar34) != '\0') || (*(char *)(lVar48 + uVar34) != '\0'))
            goto LAB_0013a955;
            goto LAB_0013a961;
          }
          if ((*(char *)(lVar45 + uVar34) == '\0') && (*(char *)(lVar48 + uVar34) == '\0')) break;
LAB_0013a66c:
          lVar24 = (long)(int)uVar34;
          cVar1 = *(char *)(lVar45 + 1 + lVar24);
          *(undefined4 *)(lVar37 + lVar24 * 4) = *(undefined4 *)(lVar37 + -8 + lVar24 * 4);
          if (cVar1 == '\0') goto LAB_0013a680;
        }
LAB_0013a608:
        iVar14 = (int)uVar34;
        uVar35 = (ulong)iVar14;
        if ((*(char *)(uVar35 + 1 + lVar45) == '\0') && (*(char *)(lVar48 + 1 + uVar35) == '\0'))
        break;
        uVar32 = (ulong)UFPC::length_;
        puVar7[uVar32] = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      *(undefined4 *)(lVar37 + (long)iVar14 * 4) = 0;
      uVar34 = (ulong)(iVar14 + 2U);
      if (local_190 <= (int)(iVar14 + 2U)) goto LAB_0013a7b7;
      goto LAB_0013a5e4;
    }
LAB_0013a7f0:
    uVar34 = (ulong)uVar15;
    lVar38 = (long)(int)uVar15;
    if (local_190 < (int)uVar15) {
      if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0')) {
LAB_0013a80d:
        *(undefined4 *)(lVar37 + lVar38 * 4) = 0;
      }
      else {
LAB_0013a888:
        if (*(char *)(lVar48 + 1 + (long)iVar14) == '\0') goto LAB_0013a89e;
        *(undefined4 *)(lVar37 + lVar38 * 4) = *(undefined4 *)(lVar37 + (long)iVar14 * 4);
      }
    }
    else {
      if (*(char *)(lVar45 + lVar38) == '\0') {
        if (*(char *)(lVar48 + lVar38) == '\0') goto LAB_0013a961;
        goto LAB_0013a888;
      }
      if (*(char *)(lVar48 + 1 + (long)iVar14) == '\0') goto LAB_0013a861;
LAB_0013a955:
      *(undefined4 *)(lVar37 + (long)(int)uVar34 * 4) =
           *(undefined4 *)(lVar37 + -8 + (long)(int)uVar34 * 4);
    }
  }
LAB_0013a988:
  if (2 < (int)uVar46) {
    lVar45 = (long)local_190;
    uVar34 = 2;
    lVar37 = 1;
    lVar48 = 3;
    lVar38 = 0;
    do {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar49 = *(long *)&pMVar3->field_0x10;
      lVar33 = **(long **)&pMVar3->field_0x48;
      lVar47 = lVar33 * uVar34;
      lVar24 = lVar49 + lVar47;
      lVar31 = lVar24 - lVar33;
      lVar11 = lVar24 + lVar33;
      lVar43 = *(long *)&pMVar4->field_0x10;
      lVar40 = **(long **)&pMVar4->field_0x48;
      lVar36 = lVar40 * uVar34;
      lVar30 = lVar43 + lVar36;
      lVar27 = lVar30 + lVar40 * -2;
      cVar1 = *(char *)(lVar49 + lVar47);
      if (2 < (int)uVar2) {
        lVar18 = lVar31 - lVar33;
        uVar35 = 0;
        uVar32 = 0;
        if (cVar1 == '\0') goto LAB_0013ab8d;
LAB_0013aaaf:
        uVar35 = uVar32;
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar29 + 1 + lVar31) == '\0') {
          uVar32 = uVar35;
          if (*(char *)(lVar24 + 1 + lVar29) != '\0') goto LAB_0013ac33;
          if (*(char *)(lVar31 + lVar29) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar15 = UFPC::length_ + 1;
            *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
            UFPC::length_ = uVar15;
            goto LAB_0013b230;
          }
          *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
          goto LAB_0013bc8e;
        }
        *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
LAB_0013d3c2:
        iVar14 = (int)uVar35;
        uVar15 = iVar14 + 2;
        if ((int)uVar15 < local_190) {
          lVar20 = (long)iVar14;
          lVar29 = lVar20 + 2;
          lVar42 = lVar33 * lVar48 + lVar20;
          lVar39 = lVar33 * lVar37 + lVar20;
          lVar25 = lVar36 + lVar20 * 4;
          lVar26 = lVar40 * lVar38 + lVar20 * 4;
          lVar21 = lVar20 << 0x20;
          lVar8 = lVar49 + lVar47 + lVar20;
          lVar9 = lVar49 + 2 + lVar39;
          lVar28 = lVar25 + lVar43 + 8;
          lVar44 = lVar43 + lVar26 + 8;
          lVar10 = 0;
          while( true ) {
            lVar22 = lVar21 >> 0x1e;
            lVar23 = lVar21 >> 0x20;
            if (*(char *)(lVar8 + 2 + lVar10) == '\0') break;
            iVar41 = (int)lVar29;
            if ((*(char *)(lVar8 + 1 + lVar10) != '\0') ||
               (*(char *)(lVar49 + lVar42 + 1 + lVar10) != '\0')) {
              uVar35 = (ulong)(uint)(iVar41 + (int)lVar10);
              goto LAB_0013cbee;
            }
            if (*(char *)(lVar9 + 1 + lVar10) == '\0') {
              uVar35 = lVar29 + lVar10;
              if (*(char *)(lVar10 + 3 + lVar47 + lVar20 + lVar49) == '\0') {
                if (*(char *)(lVar10 + 2 + lVar39 + lVar49) == '\0') {
                  *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) =
                       *(undefined4 *)(lVar27 + lVar22);
                  uVar35 = uVar35 & 0xffffffff;
                  goto LAB_0013b230;
                }
                *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar44 + lVar10 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0013bc8e;
              }
              cVar1 = *(char *)(lVar10 + 2 + lVar39 + lVar49);
              if (*(char *)(lVar31 + 4 + lVar23) != '\0') {
                if (cVar1 == '\0') goto LAB_0013db70;
                goto LAB_0013ac4d;
              }
              if (cVar1 != '\0') {
                *(undefined4 *)(lVar28 + lVar10 * 4) =
                     *(undefined4 *)(lVar26 + lVar43 + 8 + lVar10 * 4);
                goto LAB_0013da8f;
              }
              *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar27 + lVar23 * 4);
              goto LAB_0013dc7e;
            }
            if (*(char *)(lVar9 + lVar10) == '\0') {
              uVar35 = (ulong)(uint)(iVar41 + (int)lVar10);
LAB_0013d7e2:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar18 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                     *(uint *)(lVar27 + lVar29 * 4));
              }
              else {
LAB_0013d7f0:
                uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              }
              goto LAB_0013d837;
            }
            *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar44 + lVar10 * 4);
            lVar21 = lVar21 + 0x200000000;
            lVar23 = lVar29 + lVar10;
            lVar10 = lVar10 + 2;
            if (lVar45 <= lVar23 + 2) {
              iVar14 = iVar14 + (int)lVar10;
              uVar15 = iVar41 + (int)lVar10;
              goto LAB_0013d4fd;
            }
          }
          uVar35 = lVar29 + lVar10;
          if (*(char *)(lVar10 + 2 + lVar42 + lVar49) == '\0') goto LAB_0013ac04;
          lVar8 = lVar21 + 0x300000000 >> 0x20;
          lVar9 = lVar21 + 0x100000000 >> 0x20;
          if (*(char *)(lVar24 + lVar8) == '\0') {
            if (*(char *)(lVar11 + lVar9) != '\0') {
              *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar22);
              goto LAB_0013b52e;
            }
            if (*(char *)(lVar24 + lVar9) != '\0') {
              *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar22);
              goto LAB_0013b52e;
            }
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar15 = UFPC::length_ + 1;
            *(uint *)(lVar25 + lVar43 + 8 + lVar10 * 4) = UFPC::length_;
            UFPC::length_ = uVar15;
            goto LAB_0013b52e;
          }
          if (*(char *)(lVar24 + lVar9) != '\0') goto LAB_0013d717;
          if (*(char *)(lVar11 + lVar9) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0013ac15;
          }
          if (*(char *)(lVar31 + lVar8) != '\0') {
            uVar32 = uVar35 & 0xffffffff;
            goto LAB_0013d728;
          }
          if (*(char *)(lVar31 + 4 + lVar23) != '\0') goto LAB_0013cc42;
          if (*(char *)(lVar10 + 2 + lVar39 + lVar49) == '\0') {
            *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar23 * 4);
LAB_0013dc7e:
            uVar35 = lVar29 + lVar10;
            goto LAB_0013be49;
          }
          *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar43 + 8 + lVar10 * 4);
LAB_0013da8f:
          uVar35 = lVar29 + lVar10;
LAB_0013ac7d:
          lVar29 = (long)(int)uVar35;
          uVar35 = lVar29 + 2;
          if ((int)uVar35 < local_190) {
            if (*(char *)(lVar24 + uVar35) == '\0') {
              if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013c01e;
              if (*(char *)(lVar29 + 3 + lVar24) == '\0') {
LAB_0013c003:
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0013b52e;
              }
              if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
                if (*(char *)(lVar18 + uVar35) == '\0') {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                       *(uint *)(lVar30 + lVar29 * 4));
                  *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                  goto LAB_0013cb4d;
                }
LAB_0013c8fe:
                lVar29 = (long)(int)uVar35;
                uVar15 = *(uint *)(lVar27 + lVar29 * 4);
                if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
                  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                  goto LAB_0013cb4d;
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                goto LAB_0013cb4d;
              }
LAB_0013adb9:
              if (*(char *)(lVar29 + 4 + lVar31) == '\0') {
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0013c4e8;
              }
              if (*(char *)(lVar18 + 3 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                     *(uint *)(lVar30 + lVar29 * 4));
                *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
              }
              else {
                uVar32 = uVar35;
                if (*(char *)(lVar18 + uVar35) != '\0') goto LAB_0013c6e1;
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                     *(uint *)(lVar30 + lVar29 * 4));
                *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
LAB_0013c0d0:
              iVar14 = (int)uVar35;
              uVar15 = iVar14 + 2;
              if ((int)uVar15 < local_190) {
                lVar21 = (long)iVar14;
                lVar28 = lVar21 << 0x20;
                lVar25 = lVar49 + 3 + lVar47 + lVar21;
                lVar26 = lVar33 * lVar37 + lVar21 + lVar49;
                lVar8 = lVar40 * lVar38 + lVar21 * 4 + lVar43;
                lVar9 = lVar8 + 8;
                lVar29 = lVar36 + lVar21 * 4;
                lVar20 = lVar43 + lVar29 + 8;
                lVar10 = 0;
                do {
                  lVar39 = lVar28 >> 0x1e;
                  iVar41 = (int)lVar10;
                  iVar13 = (int)(lVar21 + 2);
                  if (*(char *)(lVar25 + -1 + lVar10) == '\0') {
                    if (*(char *)(lVar33 * lVar48 + lVar21 + lVar49 + 2 + lVar10) != '\0') {
                      if (*(char *)(lVar25 + lVar10) == '\0') {
                        uVar35 = (ulong)(uint)(iVar13 + iVar41);
                        *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) =
                             *(undefined4 *)(lVar30 + lVar39);
                        goto LAB_0013b52e;
                      }
                      if (*(char *)(lVar26 + 3 + lVar10) != '\0') {
                        uVar35 = (ulong)(uint)(iVar13 + iVar41);
                        *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                        goto LAB_0013cb4d;
                      }
                      goto LAB_0013c247;
                    }
                    uVar35 = lVar21 + 2 + lVar10;
                    lVar29 = lVar28 + 0x300000000 >> 0x20;
                    if (*(char *)(lVar24 + lVar29) == '\0') {
                      iVar14 = (int)uVar35;
                      goto LAB_0013af14;
                    }
                    if (*(char *)(lVar31 + lVar29) != '\0') {
                      *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                      goto LAB_0013cb4d;
                    }
                    if (*(char *)(lVar31 + 4 + (lVar28 >> 0x20)) != '\0') {
                      uVar35 = uVar35 & 0xffffffff;
LAB_0013ac4d:
                      lVar29 = (long)(int)uVar35;
                      if (*(char *)(lVar18 + 1 + lVar29) != '\0') goto LAB_0013ac60;
                      uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                           *(uint *)(lVar27 + 8 + lVar29 * 4));
                      goto LAB_0013d01f;
                    }
                    *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                    uVar35 = uVar35 & 0xffffffff;
                    goto LAB_0013ac7d;
                  }
                  if (*(char *)(lVar26 + 3 + lVar10) != '\0') {
                    uVar35 = (ulong)(uint)(iVar13 + iVar41);
                    *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                    goto LAB_0013d3c2;
                  }
                  if (*(char *)(lVar25 + lVar10) == '\0') {
                    uVar15 = iVar13 + iVar41;
                    *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) =
                         *(undefined4 *)(lVar30 + lVar39);
                    goto LAB_0013c78c;
                  }
LAB_0013c247:
                  if (*(char *)(lVar26 + 4 + lVar10) == '\0') goto LAB_0013c358;
                  uVar15 = *(uint *)(lVar8 + 0x10 + lVar10 * 4);
                  if (*(char *)(lVar33 * lVar38 + lVar21 + lVar49 + 3 + lVar10) == '\0') {
                    uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar43 + lVar29 + lVar10 * 4));
                  }
                  *(uint *)(lVar20 + lVar10 * 4) = uVar15;
                  lVar28 = lVar28 + 0x200000000;
                  lVar39 = lVar21 + lVar10;
                  lVar10 = lVar10 + 2;
                  if (lVar45 <= lVar39 + 4) {
                    iVar14 = iVar14 + (int)lVar10;
                    uVar15 = iVar13 + (int)lVar10;
                    break;
                  }
                } while( true );
              }
              uVar32 = (ulong)uVar15;
              if (local_190 < (int)uVar15) goto LAB_0013cb8d;
              lVar49 = (long)iVar14;
              if (*(char *)(lVar24 + uVar32) == '\0') {
                cVar1 = *(char *)(lVar24 + 3 + lVar49);
                if (*(char *)(lVar11 + uVar32) == '\0') {
                  if (cVar1 == '\0') goto LAB_0013d864;
                  uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
                  goto LAB_0013c83a;
                }
                if (cVar1 != '\0') goto LAB_0013c327;
LAB_0013c34b:
                uVar12 = *(undefined4 *)(lVar30 + lVar49 * 4);
              }
              else {
LAB_0013c327:
                if (*(char *)(lVar31 + 3 + lVar49) == '\0') goto LAB_0013c34b;
                uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
              }
LAB_0013c34f:
              *(undefined4 *)(lVar30 + uVar32 * 4) = uVar12;
              goto LAB_0013d58c;
            }
            if (*(char *)(lVar29 + 3 + lVar31) == '\0') {
              if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0013cc91;
              }
              goto LAB_0013adb9;
            }
            if (*(char *)(lVar18 + uVar35) == '\0') {
LAB_0013b262:
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4)
                                  );
              *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
            }
            else {
LAB_0013acb2:
              lVar29 = (long)(int)uVar35;
              uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
LAB_0013cce8:
                uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
LAB_0013d837:
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            goto LAB_0013d3c2;
          }
          uVar32 = uVar35;
          if (local_190 < (int)uVar35) {
LAB_0013cb8d:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar24 + uVar35) != '\0') goto LAB_0013d57e;
LAB_0013cb9a:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013d612;
            goto LAB_0013d57e;
          }
          uVar32 = uVar35 & 0xffffffff;
          if (*(char *)(lVar24 + uVar32) == '\0') {
            if (*(char *)(lVar11 + uVar32) == '\0') {
LAB_0013c811:
              uVar15 = (uint)uVar35;
              uVar32 = (ulong)(int)uVar15;
              if (*(char *)(uVar32 + 1 + lVar24) == '\0') goto LAB_0013d864;
              if (*(char *)(lVar31 + 1 + uVar32) == '\0') goto LAB_0013d86e;
              uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
LAB_0013c83a:
              *(undefined4 *)(lVar30 + uVar32 * 4) = uVar12;
              goto LAB_0013d58c;
            }
            if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0013ace8;
          }
          else {
LAB_0013ace8:
            if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
              uVar19 = uVar35;
              if (*(char *)(lVar18 + uVar32) == '\0') {
LAB_0013bee5:
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + uVar32 * 4),*(uint *)(lVar30 + lVar29 * 4));
                *(uint *)(lVar30 + uVar32 * 4) = uVar15;
              }
              else {
LAB_0013ce89:
                lVar24 = (long)(int)uVar19;
                uVar15 = *(uint *)(lVar27 + lVar24 * 4);
                if (*(char *)(lVar18 + -1 + lVar24) == '\0') {
                  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar24 * 4));
                  *(uint *)(lVar30 + lVar24 * 4) = uVar15;
                }
                else {
                  *(uint *)(lVar30 + lVar24 * 4) = uVar15;
                }
              }
              goto LAB_0013d58c;
            }
          }
LAB_0013cea9:
          *(undefined4 *)(lVar30 + uVar32 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
          goto LAB_0013d58c;
        }
LAB_0013d4fd:
        uVar35 = (ulong)uVar15;
        if (local_190 < (int)uVar15) {
          if (*(char *)(lVar24 + uVar35) == '\0') {
            if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013d612;
LAB_0013d65e:
            if ((*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0') &&
               (*(char *)(lVar24 + (ulong)(iVar14 + 1)) == '\0')) goto LAB_0013b01a;
          }
          else if ((*(char *)(lVar24 + (ulong)(iVar14 + 1)) == '\0') &&
                  (*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0')) {
LAB_0013d9f2:
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013ab21;
            uVar12 = *(undefined4 *)(lVar27 + (long)iVar14 * 4);
            goto LAB_0013d583;
          }
LAB_0013d677:
          uVar12 = *(undefined4 *)(lVar30 + (long)iVar14 * 4);
          goto LAB_0013d583;
        }
        if (*(char *)(lVar24 + uVar35) == '\0') {
          if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0013d845:
            uVar15 = (uint)uVar35;
            goto LAB_0013d84b;
          }
          if (*(char *)(lVar24 + (ulong)(iVar14 + 3)) == '\0') goto LAB_0013d65e;
          if (*(char *)(lVar24 + (ulong)(iVar14 + 1)) != '\0') goto LAB_0013d562;
          if (*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0') goto LAB_0013aa68;
          if (*(char *)(lVar31 + (ulong)(iVar14 + 3)) == '\0') {
            if (*(char *)(lVar31 + uVar35) == '\0') goto LAB_0013d677;
            goto LAB_0013ab21;
          }
LAB_0013d56c:
          uVar35 = (ulong)(int)uVar15;
          if (*(char *)(lVar31 + uVar35) == '\0') {
            uVar15 = *(uint *)(lVar27 + uVar35 * 4);
            if (*(char *)(lVar18 + uVar35) == '\0') {
              uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + uVar35 * 4));
              *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            }
            else {
              *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            }
            goto LAB_0013d58c;
          }
        }
        else {
          if ((*(char *)(lVar24 + (ulong)(iVar14 + 1)) != '\0') ||
             (*(char *)(lVar11 + (ulong)(iVar14 + 1)) != '\0')) {
LAB_0013d562:
            uVar15 = (uint)uVar35;
            uVar35 = (ulong)(int)uVar15;
            if (*(char *)(lVar31 + 1 + uVar35) != '\0') goto LAB_0013d56c;
LAB_0013d57e:
            uVar12 = *(undefined4 *)(lVar30 + -8 + uVar35 * 4);
            goto LAB_0013d583;
          }
          if (*(char *)(lVar31 + 3 + (long)iVar14) == '\0') goto LAB_0013d9f2;
          if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013ab21;
LAB_0013d9a2:
          uVar35 = (ulong)(int)uVar15;
          if (*(char *)(lVar18 + uVar35) == '\0') {
            uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + uVar35 * 4),*(uint *)(lVar27 + uVar35 * 4))
            ;
            *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            goto LAB_0013d58c;
          }
        }
        uVar12 = *(undefined4 *)(lVar27 + uVar35 * 4);
LAB_0013d578:
        *(undefined4 *)(lVar30 + uVar35 * 4) = uVar12;
        goto LAB_0013d58c;
      }
      if (uVar2 == 2) {
        uVar35 = 0;
        uVar15 = 0;
        if (cVar1 == '\0') {
LAB_0013b092:
          uVar15 = (uint)uVar35;
          uVar32 = (ulong)(int)uVar15;
          if (*(char *)(lVar11 + uVar32) == '\0') {
LAB_0013d84b:
            uVar35 = (ulong)uVar15;
LAB_0013d853:
            uVar15 = (uint)uVar35;
            if (*(char *)(lVar24 + 1 + (long)(int)uVar15) != '\0') goto LAB_0013aa68;
LAB_0013d864:
            uVar32 = (ulong)(int)uVar15;
            if (*(char *)(lVar11 + 1 + uVar32) == '\0') {
              *(undefined4 *)(lVar30 + uVar32 * 4) = 0;
              goto LAB_0013d58c;
            }
          }
          else if (*(char *)(lVar24 + 1 + uVar32) != '\0') goto LAB_0013aa68;
LAB_0013d86e:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar15 = UFPC::length_ + 1;
          *(uint *)(lVar30 + uVar32 * 4) = UFPC::length_;
          UFPC::length_ = uVar15;
        }
        else {
LAB_0013aa68:
          uVar35 = (ulong)(int)uVar15;
          uVar19 = (ulong)uVar15;
          if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_0013ab14;
LAB_0013ab21:
          uVar12 = *(undefined4 *)(lVar27 + uVar35 * 4);
LAB_0013d583:
          *(undefined4 *)(lVar30 + uVar35 * 4) = uVar12;
        }
      }
      else {
        uVar35 = 0;
        uVar19 = 0;
        if (cVar1 == '\0') {
LAB_0013b00d:
          uVar35 = (ulong)(int)uVar35;
          if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0013d612:
            *(undefined4 *)(lVar30 + uVar35 * 4) = 0;
            goto LAB_0013d58c;
          }
        }
        else {
LAB_0013ab14:
          uVar35 = (ulong)(int)uVar19;
          if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013ab21;
        }
LAB_0013b01a:
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar15 = UFPC::length_ + 1;
        *(uint *)(lVar30 + uVar35 * 4) = UFPC::length_;
        UFPC::length_ = uVar15;
      }
LAB_0013d58c:
      uVar34 = uVar34 + 2;
      lVar37 = lVar37 + 2;
      lVar38 = lVar38 + 2;
      lVar48 = lVar48 + 2;
    } while (uVar34 < uVar46);
  }
  if ((uVar16 & 0x80000001) != 1) goto LAB_0013ee71;
  uVar35 = (ulong)(uVar16 - 1);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar38 = *(long *)&pMVar3->field_0x10;
  lVar37 = **(long **)&pMVar3->field_0x48;
  lVar45 = lVar38 + lVar37 * uVar35;
  lVar49 = lVar45 - lVar37;
  lVar24 = *(long *)&pMVar4->field_0x10;
  lVar11 = **(long **)&pMVar4->field_0x48;
  lVar48 = lVar24 + lVar11 * uVar35;
  lVar33 = lVar48 + lVar11 * -2;
  uVar34 = 0;
  if (2 < (int)uVar2) {
    lVar30 = lVar49 - lVar37;
    lVar31 = (long)local_190;
    lVar40 = lVar11 * uVar35 + lVar24 + 8;
    lVar36 = (uVar35 - 1) * lVar37;
    lVar27 = lVar36 + lVar38 + 4;
    lVar43 = lVar37 * uVar35 + lVar38 + 3;
    lVar37 = lVar37 * (uVar35 - 2) + lVar38 + 3;
    lVar24 = lVar11 * (uVar35 - 2) + lVar24 + 0x10;
    iVar14 = -2;
    uVar34 = 0;
    do {
      lVar11 = (long)(int)uVar34;
      uVar35 = uVar34;
      if (*(char *)(lVar45 + lVar11) == '\0') goto LAB_0013deec;
      if (*(char *)((long)iVar14 + 3 + lVar49) != '\0') {
        *(undefined4 *)(lVar48 + lVar11 * 4) = *(undefined4 *)(lVar33 + lVar11 * 4);
        goto LAB_0013e758;
      }
      if (*(char *)(lVar45 + 3 + (long)iVar14) != '\0') {
LAB_0013df05:
        uVar34 = (ulong)(int)uVar35;
        if (*(char *)(lVar49 + 2 + uVar34) != '\0') {
          if (*(char *)(lVar49 + uVar34) != '\0') goto LAB_0013df1b;
          goto LAB_0013e20e;
        }
        if (*(char *)(lVar49 + uVar34) == '\0') goto LAB_0013e21c;
LAB_0013df40:
        *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + uVar34 * 4);
        lVar11 = (long)(int)uVar35;
        uVar34 = lVar11 + 2;
        if ((int)uVar34 < local_190) {
          uVar35 = uVar34;
          if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_0013e1c6;
          if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
            if (*(char *)(lVar30 + uVar34) == '\0') {
              uVar15 = UFPC::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),*(uint *)(lVar48 + lVar11 * 4)
                                  );
              *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
              goto LAB_0013e758;
            }
LAB_0013e5ac:
            lVar11 = (long)(int)uVar34;
            if (*(char *)(lVar30 + -1 + lVar11) != '\0') goto LAB_0013e8c7;
            uVar15 = UFPC::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),*(uint *)(lVar33 + lVar11 * 4))
            ;
            goto LAB_0013e910;
          }
          if (*(char *)(lVar45 + 3 + lVar11) != '\0') {
            if (*(char *)(lVar11 + 4 + lVar49) == '\0') {
              *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = *(undefined4 *)(lVar48 + lVar11 * 4);
              goto LAB_0013e4c7;
            }
            if ((*(char *)(lVar30 + 3 + lVar11) == '\0') || (*(char *)(lVar30 + uVar34) == '\0')) {
              uVar15 = UFPC::Merge(*(uint *)(lVar33 + 0x10 + lVar11 * 4),
                                   *(uint *)(lVar48 + lVar11 * 4));
              *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
              goto LAB_0013e2b5;
            }
LAB_0013e654:
            lVar11 = (long)(int)uVar34;
            uVar35 = uVar34;
            if (*(char *)(lVar30 + -1 + lVar11) != '\0') goto LAB_0013df2e;
            uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
            uVar6 = *(uint *)(lVar48 + -8 + lVar11 * 4);
LAB_0013e00c:
            uVar15 = UFPC::Merge(uVar15,uVar6);
            do {
              *(uint *)(lVar48 + lVar11 * 4) = uVar15;
              uVar34 = uVar35;
LAB_0013e2b5:
              iVar14 = (int)uVar34;
              uVar15 = iVar14 + 2;
              if (local_190 <= (int)uVar15) {
LAB_0013eb2a:
                if (local_190 < (int)uVar15) {
                  uVar34 = (ulong)uVar15;
                  goto LAB_0013ec88;
                }
                lVar38 = (long)(int)uVar15;
                lVar37 = (long)iVar14;
                if (*(char *)(lVar45 + lVar38) == '\0') {
                  if (*(char *)(lVar45 + 3 + lVar37) == '\0') goto LAB_0013edcc;
                  goto LAB_0013edbe;
                }
                if (*(char *)(lVar49 + 3 + lVar37) != '\0') goto LAB_0013edbe;
LAB_0013eb90:
                uVar12 = *(undefined4 *)(lVar48 + lVar37 * 4);
                goto LAB_0013edc3;
              }
              lVar29 = (long)iVar14;
              lVar25 = lVar29 << 0x20;
              lVar11 = lVar40 + lVar29 * 4;
              lVar47 = lVar27 + lVar29;
              lVar18 = lVar24 + lVar29 * 4;
              lVar26 = 0;
              while (*(char *)(lVar43 + lVar29 + -1 + lVar26) != '\0') {
                iVar41 = (int)lVar26;
                if (*(char *)(lVar47 + -1 + lVar26) != '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar18 + -8 + lVar26 * 4);
                  goto LAB_0013e758;
                }
                if (*(char *)(lVar43 + lVar29 + lVar26) == '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar48 + (lVar25 >> 0x1e));
                  goto LAB_0013e9ef;
                }
                if (*(char *)(lVar47 + lVar26) == '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar48 + (lVar25 >> 0x1e));
                  goto LAB_0013e4c7;
                }
                uVar15 = *(uint *)(lVar18 + lVar26 * 4);
                if (*(char *)(lVar37 + lVar29 + lVar26) == '\0') {
                  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar11 + -8 + lVar26 * 4));
                }
                *(uint *)(lVar11 + lVar26 * 4) = uVar15;
                lVar25 = lVar25 + 0x200000000;
                lVar8 = lVar29 + lVar26;
                lVar26 = lVar26 + 2;
                if (lVar31 <= lVar8 + 4) {
                  uVar15 = iVar14 + (int)lVar26 + 2;
                  iVar14 = iVar14 + (int)lVar26;
                  goto LAB_0013eb2a;
                }
              }
              uVar35 = (uVar34 & 0xffffffff) + lVar26 + 2;
              iVar14 = (int)uVar35;
              lVar11 = lVar25 + 0x300000000 >> 0x20;
              uVar34 = lVar29 + 2 + lVar26;
              if (*(char *)(lVar45 + lVar11) == '\0') goto LAB_0013e04e;
              if (*(char *)(lVar49 + lVar11) != '\0') {
LAB_0013e1db:
                do {
                  *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + uVar34 * 4);
                  uVar34 = (long)(int)uVar35 + 2;
                  if (local_190 <= (int)uVar34) {
                    if (local_190 < (int)uVar34) goto LAB_0013ec88;
                    if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_0013eda0;
LAB_0013eb57:
                    lVar38 = (long)(int)uVar34;
                    if (*(char *)(lVar49 + 1 + lVar38) == '\0') {
                      uVar15 = *(uint *)(lVar48 + -8 + lVar38 * 4);
                    }
                    else if (*(char *)(lVar49 + lVar38) == '\0') {
                      uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                      if (*(char *)(lVar30 + lVar38) != '\0') {
                        *(uint *)(lVar48 + lVar38 * 4) = uVar15;
                        goto LAB_0013ee71;
                      }
                      uVar6 = *(uint *)(lVar48 + -8 + lVar38 * 4);
LAB_0013ee68:
                      uVar15 = UFPC::Merge(uVar15,uVar6);
                    }
                    else {
LAB_0013eb70:
                      uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                    }
LAB_0013ee6d:
                    *(uint *)(lVar48 + lVar38 * 4) = uVar15;
                    goto LAB_0013ee71;
                  }
                  uVar35 = uVar34;
                  if (*(char *)(lVar45 + uVar34) != '\0') goto LAB_0013e7f6;
LAB_0013deec:
                  iVar14 = (int)uVar35;
                  uVar34 = (ulong)iVar14;
                  if (*(char *)(uVar34 + 1 + lVar45) == '\0') {
                    while( true ) {
                      uVar34 = (ulong)iVar14;
LAB_0013e04e:
                      *(undefined4 *)(lVar48 + uVar34 * 4) = 0;
                      lVar11 = (long)iVar14;
                      uVar34 = lVar11 + 2;
                      if (local_190 <= (int)uVar34) break;
                      uVar35 = uVar34;
                      if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_0013deec;
                      if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
                        if ((*(char *)(lVar49 + uVar34) == '\0') &&
                           (*(char *)(lVar49 + 1 + lVar11) != '\0')) goto LAB_0013e8b9;
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                             *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                        goto LAB_0013e758;
                      }
                      if (*(char *)(lVar45 + 3 + lVar11) == '\0') {
                        if (*(char *)(lVar49 + uVar34) == '\0') {
                          if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar15 = UFPC::length_ + 1;
                            *(uint *)(lVar48 + 8 + lVar11 * 4) = UFPC::length_;
                            UFPC::length_ = uVar15;
                            goto LAB_0013e9ef;
                          }
                          uVar12 = *(undefined4 *)(lVar33 + lVar11 * 4);
                        }
                        else {
                          uVar12 = *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                        }
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = uVar12;
                        goto LAB_0013e9ef;
                      }
                      cVar1 = *(char *)(lVar11 + 2 + lVar49);
                      if (*(char *)(lVar11 + 4 + lVar49) != '\0') {
                        if (cVar1 != '\0') goto LAB_0013df1b;
                        if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                               *(undefined4 *)(lVar33 + 0x10 + lVar11 * 4);
                        }
                        else {
LAB_0013e888:
                          lVar11 = (long)(int)uVar34;
                          if ((*(char *)(lVar30 + 1 + lVar11) == '\0') ||
                             (*(char *)(lVar30 + lVar11) == '\0')) {
                            uVar15 = UFPC::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),
                                                 *(uint *)(lVar33 + 8 + lVar11 * 4));
                          }
                          else {
                            uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                          }
                          *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                        }
                        goto LAB_0013e2b5;
                      }
                      if (cVar1 != '\0') goto LAB_0013df40;
                      if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar15 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                      }
                      else {
                        uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                      }
LAB_0013e156:
                      *(uint *)(lVar48 + uVar34 * 4) = uVar15;
                      lVar11 = (long)(int)uVar35;
                      uVar34 = lVar11 + 2;
                      if (local_190 <= (int)uVar34) {
                        if (local_190 < (int)uVar34) goto LAB_0013ec88;
                        if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_0013ebc5;
                        if (*(char *)(lVar49 + 3 + lVar11) == '\0') goto LAB_0013ee41;
                        goto LAB_0013ed61;
                      }
                      uVar35 = uVar34;
                      if (*(char *)(lVar45 + uVar34) != '\0') {
                        if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
                          uVar15 = UFPC::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),
                                               *(uint *)(lVar48 + lVar11 * 4));
                          *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
                          goto LAB_0013e758;
                        }
                        if (*(char *)(lVar45 + 3 + lVar11) == '\0') {
                          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                               *(undefined4 *)(lVar48 + lVar11 * 4);
                          goto LAB_0013e9ef;
                        }
                        if (*(char *)(lVar11 + 4 + lVar49) != '\0') {
                          uVar15 = UFPC::Merge(*(uint *)(lVar33 + 0x10 + lVar11 * 4),
                                               *(uint *)(lVar48 + lVar11 * 4));
                          *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
                          goto LAB_0013e2b5;
                        }
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                             *(undefined4 *)(lVar48 + lVar11 * 4);
LAB_0013e4c7:
                        while( true ) {
                          iVar14 = (int)uVar34;
                          uVar15 = iVar14 + 2;
                          if (local_190 <= (int)uVar15) break;
                          lVar25 = (long)iVar14;
                          lVar11 = lVar25 + 2;
                          lVar29 = lVar25 << 0x20;
                          lVar47 = lVar40 + lVar25 * 4;
                          lVar18 = lVar27 + lVar25;
                          lVar26 = 0;
                          while( true ) {
                            if (*(char *)(lVar43 + lVar25 + -1 + lVar26) == '\0') {
                              uVar35 = (ulong)(uint)((int)lVar11 + (int)lVar26);
                              goto LAB_0013e1c6;
                            }
                            lVar9 = lVar29 >> 0x20;
                            lVar8 = lVar29 >> 0x1e;
                            if (*(char *)(lVar18 + -1 + lVar26) != '\0') break;
                            if (*(char *)(lVar43 + lVar25 + lVar26) == '\0') {
                              *(undefined4 *)(lVar47 + lVar26 * 4) = *(undefined4 *)(lVar48 + lVar8)
                              ;
                              uVar34 = (ulong)(uint)((int)lVar11 + (int)lVar26);
                              goto LAB_0013e9ef;
                            }
                            if (*(char *)(lVar18 + lVar26) != '\0') {
                              if (*(char *)(lVar26 + lVar37 + lVar25) == '\0') {
                                uVar15 = UFPC::Merge(*(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4),
                                                     *(uint *)(lVar48 + lVar8));
                                *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                              }
                              else {
                                if (*(char *)(lVar26 + -1 + lVar37 + lVar25) == '\0') {
                                  uVar15 = *(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4);
                                  uVar6 = *(uint *)(lVar48 + lVar8);
                                }
                                else {
                                  if (*(char *)(lVar49 + lVar9) != '\0') {
                                    uVar34 = lVar11 + lVar26 & 0xffffffff;
                                    goto LAB_0013e654;
                                  }
                                  uVar15 = *(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4);
                                  uVar6 = *(uint *)(lVar48 + lVar9 * 4);
                                }
                                uVar15 = UFPC::Merge(uVar15,uVar6);
                                *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                              }
                              uVar34 = lVar11 + lVar26 & 0xffffffff;
                              goto LAB_0013e2b5;
                            }
                            *(undefined4 *)(lVar47 + lVar26 * 4) =
                                 *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
                            lVar29 = lVar29 + 0x200000000;
                            lVar8 = lVar26 + lVar11;
                            lVar26 = lVar26 + 2;
                            if (lVar31 <= lVar8 + 2) {
                              uVar15 = iVar14 + (int)lVar26 + 2;
                              iVar14 = iVar14 + (int)lVar26;
                              goto LAB_0013ea9a;
                            }
                          }
                          if (*(char *)(lVar26 + -1 + lVar37 + lVar25) == '\0') {
                            uVar15 = *(uint *)(lVar24 + lVar25 * 4 + -8 + lVar26 * 4);
                            uVar6 = *(uint *)(lVar48 + lVar8);
                          }
                          else {
                            if (*(char *)(lVar49 + lVar9) != '\0') {
                              uVar34 = lVar11 + lVar26 & 0xffffffff;
                              goto LAB_0013e5ac;
                            }
                            uVar15 = *(uint *)(lVar24 + lVar25 * 4 + -8 + lVar26 * 4);
                            uVar6 = *(uint *)(lVar48 + lVar9 * 4);
                          }
                          uVar15 = UFPC::Merge(uVar15,uVar6);
                          *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                          uVar34 = lVar11 + lVar26 & 0xffffffff;
LAB_0013e758:
                          iVar14 = (int)uVar34;
                          uVar15 = iVar14 + 2;
                          if (local_190 <= (int)uVar15) {
LAB_0013ea63:
                            uVar34 = (ulong)uVar15;
                            lVar38 = (long)(int)uVar15;
                            if (local_190 < (int)uVar15) {
                              if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013edcc;
                              lVar37 = (long)iVar14;
                              if (*(char *)(lVar45 + 1 + lVar37) != '\0') goto LAB_0013eb90;
                            }
                            else {
                              if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013eda0;
                              if (*(char *)(lVar45 + 1 + (long)iVar14) != '\0') goto LAB_0013eb57;
                              if (*(char *)(lVar49 + 3 + (long)iVar14) != '\0') {
                                if (*(char *)(lVar49 + lVar38) == '\0') goto LAB_0013ecbf;
                                goto LAB_0013edbe;
                              }
                            }
                            if (*(char *)(lVar49 + lVar38) != '\0') goto LAB_0013edbe;
                            uVar12 = *(undefined4 *)(lVar33 + (long)iVar14 * 4);
                            goto LAB_0013edc3;
                          }
                          lVar25 = (long)iVar14;
                          lVar11 = lVar25 + 2;
                          lVar47 = lVar24 + lVar25 * 4;
                          lVar18 = lVar38 + lVar36 + 2 + lVar25;
                          lVar29 = lVar43 + lVar25;
                          lVar25 = lVar40 + lVar25 * 4;
                          lVar26 = 0;
LAB_0013e79f:
                          iVar41 = (int)lVar11;
                          iVar13 = (int)lVar26;
                          if (*(char *)(lVar29 + -1 + lVar26) == '\0') {
                            uVar35 = (ulong)(uint)(iVar41 + iVar13);
                            goto LAB_0013deec;
                          }
                          if (*(char *)(lVar29 + -2 + lVar26) == '\0') {
                            if (*(char *)(lVar18 + 1 + lVar26) == '\0') {
                              uVar34 = lVar11 + lVar26;
                              if (*(char *)(lVar26 + lVar29) == '\0') {
                                if (*(char *)(lVar26 + lVar18) == '\0') {
                                  uVar12 = *(undefined4 *)(lVar47 + -0x10 + lVar26 * 4);
                                }
                                else {
                                  uVar12 = *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
                                }
                                *(undefined4 *)(lVar25 + lVar26 * 4) = uVar12;
                                uVar34 = uVar34 & 0xffffffff;
                                goto LAB_0013e9ef;
                              }
                              if (*(char *)(lVar26 + 2 + lVar18) != '\0') {
                                uVar34 = uVar34 & 0xffffffff;
                                uVar35 = uVar34;
                                if (*(char *)(lVar26 + lVar18) == '\0') goto LAB_0013e888;
                                goto LAB_0013df1b;
                              }
                              if (*(char *)(lVar26 + lVar18) == '\0') {
                                uVar35 = uVar34 & 0xffffffff;
                                uVar15 = *(uint *)(lVar47 + -0x10 + lVar26 * 4);
                                goto LAB_0013e156;
                              }
                              uVar35 = uVar34 & 0xffffffff;
                              goto LAB_0013df40;
                            }
                            if (*(char *)(lVar18 + lVar26) != '\0') goto code_r0x0013e7c4;
                            uVar34 = (ulong)(uint)(iVar41 + iVar13);
LAB_0013e8b9:
                            lVar11 = (long)(int)uVar34;
                            if (*(char *)(lVar30 + lVar11) == '\0') {
                              uVar15 = UFPC::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),
                                                   *(uint *)(lVar33 + lVar11 * 4));
                            }
                            else {
LAB_0013e8c7:
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                            }
LAB_0013e910:
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_0013e758;
                          }
                          uVar34 = (ulong)(uint)(iVar41 + iVar13);
LAB_0013e7f6:
                          lVar11 = (long)(int)uVar34;
                          if (*(char *)(lVar11 + 1 + lVar49) != '\0') {
                            if (*(char *)(lVar49 + lVar11) == '\0') {
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                              if (*(char *)(lVar30 + lVar11) != '\0') {
                                *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                                goto LAB_0013e758;
                              }
                              uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar48 + -8 + lVar11 * 4));
                            }
                            else {
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                            }
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_0013e758;
                          }
                          if (*(char *)(lVar45 + 1 + lVar11) == '\0') {
                            *(undefined4 *)(lVar48 + lVar11 * 4) =
                                 *(undefined4 *)(lVar48 + -8 + lVar11 * 4);
                            goto LAB_0013e9ef;
                          }
                          if (*(char *)(lVar11 + 2 + lVar49) != '\0') {
                            if (*(char *)(lVar30 + 1 + lVar11) == '\0') {
                              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
LAB_0013e990:
                              uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar48 + -8 + lVar11 * 4));
                            }
                            else {
                              if (*(char *)(lVar49 + lVar11) == '\0') {
                                uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                                if (*(char *)(lVar30 + lVar11) == '\0') goto LAB_0013e990;
                                *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                                goto LAB_0013e2b5;
                              }
                              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                            }
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_0013e2b5;
                          }
                          *(undefined4 *)(lVar48 + lVar11 * 4) =
                               *(undefined4 *)(lVar48 + -8 + lVar11 * 4);
                        }
LAB_0013ea9a:
                        uVar34 = (ulong)uVar15;
                        if (local_190 < (int)uVar15) goto LAB_0013ec88;
                        lVar38 = (long)(int)uVar15;
                        if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013ebc5;
                        lVar45 = (long)iVar14;
                        if (*(char *)(lVar49 + 3 + lVar45) == '\0') {
                          uVar15 = *(uint *)(lVar48 + lVar45 * 4);
                          goto LAB_0013ee6d;
                        }
                        if (*(char *)(lVar30 + lVar38) == '\0') {
                          uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                          uVar6 = *(uint *)(lVar48 + lVar45 * 4);
                          goto LAB_0013ee68;
                        }
                        if (*(char *)(lVar49 + lVar45) != '\0') goto LAB_0013eae9;
                        uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                        uVar6 = *(uint *)(lVar48 + lVar45 * 4);
                        goto LAB_0013ee36;
                      }
LAB_0013e1c6:
                      iVar14 = (int)uVar35;
                      uVar34 = (ulong)iVar14;
                      if (*(char *)(uVar34 + 1 + lVar45) != '\0') {
                        if (*(char *)(lVar49 + 1 + uVar34) != '\0') goto LAB_0013e1db;
                        uVar34 = (ulong)iVar14;
                        if (*(char *)(uVar34 + 2 + lVar49) != '\0') goto LAB_0013e20e;
LAB_0013e21c:
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar15 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                        goto LAB_0013e156;
                      }
                    }
                    if (local_190 < (int)uVar34) {
                      if (*(char *)(lVar45 + uVar34) == '\0') {
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = 0;
                        goto LAB_0013ee71;
                      }
LAB_0013edfc:
                      if (*(char *)(lVar49 + uVar34) != '\0') goto LAB_0013ee04;
                      if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar15 = UFPC::length_ + 1;
                        *(uint *)(lVar48 + 8 + lVar11 * 4) = UFPC::length_;
                        UFPC::length_ = uVar15;
                        goto LAB_0013ee71;
                      }
                      uVar12 = *(undefined4 *)(lVar33 + lVar11 * 4);
                    }
                    else {
                      if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_0013eda0;
                      if (*(char *)(lVar49 + 3 + lVar11) == '\0') goto LAB_0013edfc;
                      if ((*(char *)(lVar49 + uVar34) == '\0') &&
                         (*(char *)(lVar49 + 1 + lVar11) != '\0')) {
LAB_0013ecbf:
                        lVar38 = (long)(int)uVar34;
                        if (*(char *)(lVar30 + lVar38) != '\0') goto LAB_0013eb70;
                        uVar15 = *(uint *)(lVar33 + -8 + lVar38 * 4);
                        uVar6 = *(uint *)(lVar33 + lVar38 * 4);
                        goto LAB_0013ee68;
                      }
LAB_0013ee04:
                      uVar12 = *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                    }
                    *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_0013ee71;
                  }
                } while (*(char *)(lVar49 + 1 + uVar34) != '\0');
                goto LAB_0013df05;
              }
              if (*(char *)(lVar49 + 4 + (lVar25 >> 0x20)) == '\0') goto LAB_0013df40;
LAB_0013df1b:
              lVar11 = (long)(int)uVar35;
              if (*(char *)(lVar30 + 1 + lVar11) == '\0') goto LAB_0013e002;
LAB_0013df2e:
              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = *(undefined4 *)(lVar48 + lVar11 * 4);
          goto LAB_0013e9ef;
        }
        if (local_190 < (int)uVar34) {
LAB_0013ec88:
          lVar38 = (long)(int)uVar34;
          if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_0013edcc;
          uVar12 = *(undefined4 *)(lVar48 + -8 + lVar38 * 4);
          goto LAB_0013edc3;
        }
        if (*(char *)(lVar45 + uVar34) == '\0') {
LAB_0013ebc5:
          lVar38 = (long)(int)uVar34;
          if (*(char *)(lVar38 + 1 + lVar45) == '\0') {
            *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
            goto LAB_0013ee71;
          }
          cVar1 = *(char *)(lVar49 + 1 + lVar38);
          goto joined_r0x0013ebdd;
        }
        if (*(char *)(lVar49 + 3 + lVar11) == '\0') {
LAB_0013ee41:
          uVar15 = *(uint *)(lVar48 + lVar11 * 4);
        }
        else {
          if (*(char *)(lVar30 + uVar34) != '\0') {
LAB_0013eae9:
            lVar38 = (long)(int)uVar34;
            if (*(char *)(lVar30 + -1 + lVar38) == '\0') {
              uVar15 = *(uint *)(lVar33 + -8 + lVar38 * 4);
              uVar6 = *(uint *)(lVar33 + lVar38 * 4);
LAB_0013ee36:
              uVar15 = UFPC::Merge(uVar15,uVar6);
            }
            else {
              uVar15 = *(uint *)(lVar33 + lVar38 * 4);
            }
            *(uint *)(lVar48 + lVar38 * 4) = uVar15;
            goto LAB_0013ee71;
          }
LAB_0013ed61:
          uVar15 = UFPC::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),*(uint *)(lVar48 + lVar11 * 4));
        }
        *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
        goto LAB_0013ee71;
      }
      if (*(char *)(lVar49 + lVar11) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar15 = UFPC::length_ + 1;
        *(uint *)(lVar48 + lVar11 * 4) = UFPC::length_;
        UFPC::length_ = uVar15;
      }
      else {
        *(undefined4 *)(lVar48 + lVar11 * 4) = *(undefined4 *)(lVar33 + lVar11 * 4);
      }
LAB_0013e9ef:
      iVar14 = (int)uVar34;
      uVar34 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_190);
  }
  iVar14 = (int)uVar34;
  lVar38 = (long)iVar14;
  if (local_190 < iVar14) {
    if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_0013edcc:
      *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
      goto LAB_0013ee71;
    }
LAB_0013edb4:
    lVar38 = (long)iVar14;
    cVar1 = *(char *)(lVar49 + lVar38);
joined_r0x0013ebdd:
    if (cVar1 == '\0') {
      UFPC::P_[UFPC::length_] = UFPC::length_;
      uVar15 = UFPC::length_ + 1;
      *(uint *)(lVar48 + lVar38 * 4) = UFPC::length_;
      UFPC::length_ = uVar15;
      goto LAB_0013ee71;
    }
  }
  else {
    if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_0013eda0:
      iVar14 = (int)uVar34;
      lVar38 = (long)iVar14;
      if (*(char *)(lVar45 + 1 + lVar38) == '\0') goto LAB_0013edcc;
    }
    lVar38 = (long)iVar14;
    if (*(char *)(lVar49 + 1 + lVar38) == '\0') goto LAB_0013edb4;
  }
LAB_0013edbe:
  uVar12 = *(undefined4 *)(lVar33 + lVar38 * 4);
LAB_0013edc3:
  *(undefined4 *)(lVar48 + lVar38 * 4) = uVar12;
LAB_0013ee71:
  puVar7 = UFPC::P_;
  uVar15 = 1;
  if (1 < UFPC::length_) {
    uVar15 = 1;
    uVar34 = 1;
    do {
      if (puVar7[uVar34] < uVar34) {
        puVar7[uVar34] = puVar7[puVar7[uVar34]];
      }
      else {
        puVar7[uVar34] = uVar15;
        uVar15 = uVar15 + 1;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
  puVar7 = UFPC::P_;
  uVar34 = 0;
  iVar14 = (int)(uVar17 & 0xfffffffffffffffe);
  if (0 < (int)uVar46) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar37 = *(long *)&pMVar3->field_0x10;
    lVar24 = **(long **)&pMVar3->field_0x48;
    lVar11 = *(long *)&pMVar4->field_0x10;
    lVar49 = **(long **)&pMVar4->field_0x48;
    lVar38 = lVar11 + lVar49;
    lVar48 = lVar37 + 1 + lVar24;
    lVar45 = lVar37 + 1;
    uVar34 = 0;
    lVar33 = lVar11;
    do {
      puVar5 = UFPC::P_;
      lVar40 = lVar49 * uVar34 + lVar11;
      lVar43 = lVar40 + lVar49;
      if (iVar14 < 1) {
        uVar35 = 0;
      }
      else {
        uVar35 = 0;
        do {
          lVar36 = (long)*(int *)(lVar33 + uVar35 * 4);
          if (lVar36 < 1) {
            *(undefined8 *)(lVar33 + uVar35 * 4) = 0;
            uVar32 = uVar35 + 1;
            *(undefined4 *)(lVar38 + uVar35 * 4) = 0;
            uVar15 = 0;
          }
          else {
            uVar15 = puVar5[lVar36];
            uVar6 = uVar15;
            if (*(char *)(lVar45 + -1 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar33 + uVar35 * 4) = uVar6;
            uVar32 = uVar35 | 1;
            uVar6 = uVar15;
            if (*(char *)(lVar45 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar33 + 4 + uVar35 * 4) = uVar6;
            uVar6 = uVar15;
            if (*(char *)(lVar48 + -1 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar38 + uVar35 * 4) = uVar6;
            if (*(char *)(lVar48 + uVar35) == '\0') {
              uVar15 = 0;
            }
          }
          *(uint *)(lVar43 + uVar32 * 4) = uVar15;
          uVar35 = uVar35 + 2;
        } while ((long)uVar35 < (long)(uVar17 & 0xfffffffffffffffe));
      }
      if ((uVar2 & 0x80000001) == 1) {
        lVar36 = (long)*(int *)(lVar40 + uVar35 * 4);
        if (lVar36 < 1) {
          *(undefined4 *)(lVar40 + uVar35 * 4) = 0;
          *(undefined4 *)(lVar43 + uVar35 * 4) = 0;
        }
        else {
          lVar30 = lVar24 * uVar34 + lVar37;
          uVar15 = puVar7[lVar36];
          uVar6 = uVar15;
          if (*(char *)(lVar30 + uVar35) == '\0') {
            uVar6 = 0;
          }
          *(uint *)(lVar40 + uVar35 * 4) = uVar6;
          if (*(char *)(lVar30 + lVar24 + uVar35) == '\0') {
            *(undefined4 *)(lVar43 + uVar35 * 4) = 0;
          }
          else {
            *(uint *)(lVar43 + uVar35 * 4) = uVar15;
          }
        }
      }
      uVar34 = uVar34 + 2;
      lVar38 = lVar38 + lVar49 * 2;
      lVar48 = lVar48 + lVar24 * 2;
      lVar45 = lVar45 + lVar24 * 2;
      lVar33 = lVar33 + lVar49 * 2;
    } while (uVar34 < uVar46);
    uVar34 = uVar34 & 0xffffffff;
  }
  puVar7 = UFPC::P_;
  if ((uVar16 & 0x80000001) == 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar45 = *(long *)&pMVar3->field_0x10;
    lVar37 = **(long **)&pMVar3->field_0x48 * uVar34;
    lVar48 = *(long *)&pMVar4->field_0x10;
    lVar38 = uVar34 * **(long **)&pMVar4->field_0x48;
    if (iVar14 < 1) {
      uVar34 = 0;
    }
    else {
      lVar24 = lVar37 + lVar45;
      lVar11 = lVar38 + lVar48;
      uVar34 = 0;
      do {
        lVar49 = (long)*(int *)(lVar11 + uVar34 * 4);
        if (lVar49 < 1) {
          *(undefined8 *)(lVar11 + uVar34 * 4) = 0;
        }
        else {
          uVar16 = puVar7[lVar49];
          uVar46 = uVar16;
          if (*(char *)(lVar24 + uVar34) == '\0') {
            uVar46 = 0;
          }
          *(uint *)(lVar11 + uVar34 * 4) = uVar46;
          if (*(char *)(lVar24 + 1 + uVar34) == '\0') {
            *(undefined4 *)(lVar11 + 4 + uVar34 * 4) = 0;
          }
          else {
            *(uint *)(lVar11 + 4 + uVar34 * 4) = uVar16;
          }
        }
        uVar34 = uVar34 + 2;
      } while (uVar34 < (uVar17 & 0xfffffffe));
    }
    if ((uVar2 & 0x80000001) == 1) {
      lVar48 = lVar48 + lVar38;
      lVar38 = (long)*(int *)(lVar48 + uVar34 * 4);
      uVar16 = 0;
      if ((0 < lVar38) && (uVar16 = 0, *(char *)(lVar45 + lVar37 + uVar34) != '\0')) {
        uVar16 = UFPC::P_[lVar38];
      }
      *(uint *)(lVar48 + uVar34 * 4) = uVar16;
    }
  }
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
  }
  return;
LAB_0013a557:
  uVar12 = 0;
LAB_0013a56c:
  *(undefined4 *)(lVar48 + lVar38 * 4) = uVar12;
  uVar6 = uVar15;
LAB_0013a570:
  uVar15 = uVar6 + 2;
  if (iVar14 <= (int)uVar15) goto LAB_0013a57f;
  goto LAB_0013a4c1;
LAB_0013c358:
  *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar39);
  uVar35 = (ulong)(uint)(iVar13 + iVar41);
LAB_0013c4e8:
  iVar14 = (int)uVar35;
  uVar15 = iVar14 + 2;
  if ((int)uVar15 < local_190) {
    lVar8 = (long)iVar14;
    lVar29 = lVar8 + 2;
    lVar26 = lVar8 << 0x20;
    lVar25 = lVar36 + lVar8 * 4;
    lVar9 = lVar43 + lVar25 + 8;
    lVar10 = lVar47 + lVar8 + lVar49;
    lVar20 = lVar10 + 3;
    lVar21 = lVar33 * lVar37 + lVar8 + lVar49;
    lVar28 = 0;
    do {
      iVar41 = (int)lVar29;
      lVar39 = lVar26 >> 0x20;
      lVar42 = lVar26 >> 0x1e;
      iVar13 = (int)lVar28;
      if (*(char *)(lVar10 + 2 + lVar28) == '\0') {
        if (*(char *)(lVar33 * lVar48 + lVar8 + lVar49 + 2 + lVar28) == '\0') {
          uVar35 = (ulong)(uint)(iVar41 + iVar13);
          goto LAB_0013c01e;
        }
        if (*(char *)(lVar20 + lVar28) == '\0') {
          uVar35 = (ulong)(uint)(iVar41 + iVar13);
          *(undefined4 *)(lVar25 + lVar43 + 8 + lVar28 * 4) = *(undefined4 *)(lVar30 + lVar42);
          goto LAB_0013b52e;
        }
        if (*(char *)(lVar21 + 3 + lVar28) != '\0') {
          uVar35 = lVar29 + lVar28;
          if (*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) == '\0') {
            uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                 *(uint *)(lVar30 + lVar42));
          }
          else {
            if (*(char *)(lVar31 + lVar39) != '\0') goto LAB_0013c8fe;
            uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                 *(uint *)(lVar30 + lVar39 * 4));
          }
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
          goto LAB_0013cb4d;
        }
      }
      else {
        if (*(char *)(lVar21 + 3 + lVar28) != '\0') {
          uVar35 = lVar29 + lVar28;
          if (*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) == '\0') {
            uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                 *(uint *)(lVar30 + lVar42));
          }
          else {
            if (*(char *)(lVar31 + lVar39) != '\0') goto LAB_0013acb2;
            uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                 *(uint *)(lVar30 + lVar39 * 4));
          }
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
          goto LAB_0013d3c2;
        }
        if (*(char *)(lVar20 + lVar28) == '\0') goto LAB_0013c758;
      }
      if (*(char *)(lVar21 + 4 + lVar28) != '\0') {
        uVar32 = lVar29 + lVar28;
        if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
          uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 0x10 + lVar28 * 4),
                               *(uint *)(lVar30 + lVar39 * 4));
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
        }
        else {
          if ((*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) != '\0') &&
             (*(char *)(lVar31 + lVar39) != '\0')) goto LAB_0013c6e1;
          uVar15 = UFPC::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 0x10 + lVar28 * 4),
                               *(uint *)(lVar30 + lVar39 * 4));
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
        }
        uVar35 = uVar32 & 0xffffffff;
        goto LAB_0013c0d0;
      }
      *(undefined4 *)(lVar9 + lVar28 * 4) = *(undefined4 *)(lVar43 + lVar25 + lVar28 * 4);
      lVar26 = lVar26 + 0x200000000;
      lVar39 = lVar29 + lVar28;
      lVar28 = lVar28 + 2;
      if (lVar45 <= lVar39 + 2) {
        iVar14 = iVar14 + (int)lVar28;
        uVar15 = iVar41 + (int)lVar28;
        break;
      }
    } while( true );
  }
  uVar35 = (ulong)uVar15;
  uVar32 = uVar35;
  if (local_190 < (int)uVar15) goto LAB_0013cb8d;
  lVar49 = (long)iVar14;
  if (*(char *)(lVar24 + uVar35) == '\0') {
    if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013c811;
    if (*(char *)(lVar24 + 3 + lVar49) != '\0') goto LAB_0013c62f;
  }
  else {
LAB_0013c62f:
    if (*(char *)(lVar31 + 3 + lVar49) != '\0') {
      uVar19 = uVar35;
      if (*(char *)(lVar18 + uVar35) == '\0') {
        uVar15 = *(uint *)(lVar27 + uVar35 * 4);
        uVar6 = *(uint *)(lVar30 + lVar49 * 4);
      }
      else {
LAB_0013ce7f:
        uVar35 = (ulong)(int)uVar19;
        if (*(char *)((uVar35 - 2) + lVar31) != '\0') goto LAB_0013ce89;
        uVar15 = *(uint *)(lVar27 + uVar35 * 4);
        uVar6 = *(uint *)(lVar30 + -8 + uVar35 * 4);
      }
      uVar15 = UFPC::Merge(uVar15,uVar6);
      *(uint *)(lVar30 + uVar35 * 4) = uVar15;
      goto LAB_0013d58c;
    }
  }
  uVar12 = *(undefined4 *)(lVar30 + lVar49 * 4);
  goto LAB_0013d578;
LAB_0013c758:
  uVar15 = iVar41 + iVar13;
  *(undefined4 *)(lVar25 + lVar43 + 8 + lVar28 * 4) = *(undefined4 *)(lVar30 + lVar42);
LAB_0013c78c:
  uVar35 = (ulong)uVar15;
LAB_0013cc91:
  do {
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    uVar15 = (uint)uVar35;
    if (local_190 <= (int)uVar15) {
      uVar32 = uVar35 & 0xffffffff;
      if (local_190 < (int)uVar15) {
        if (*(char *)(lVar24 + uVar32) == '\0') {
LAB_0013cf52:
          iVar14 = (int)uVar35;
          uVar35 = uVar35 & 0xffffffff;
          if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013d612;
LAB_0013cf5f:
          uVar35 = (ulong)iVar14;
          if (*(char *)(lVar11 + -1 + uVar35) == '\0') goto LAB_0013b01a;
          goto LAB_0013d57e;
        }
        uVar19 = uVar35;
        if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013ab14;
      }
      else {
        if (*(char *)(lVar24 + uVar32) == '\0') {
          if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0013d853;
          if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
LAB_0013cf92:
            iVar14 = (int)uVar35;
            goto LAB_0013cf5f;
          }
        }
        if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013aa68;
        if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
          if (*(char *)(lVar31 + lVar29) == '\0') goto LAB_0013bee5;
LAB_0013cd78:
          uVar15 = (uint)uVar35;
          if (*(char *)(lVar18 + -1 + (long)(int)uVar15) != '\0') goto LAB_0013d56c;
          uVar35 = uVar35 & 0xffffffff;
          uVar6 = *(uint *)(lVar27 + uVar35 * 4);
          uVar15 = *(uint *)(lVar30 + -8 + (long)(int)uVar15 * 4);
LAB_0013b7a6:
          uVar15 = UFPC::Merge(uVar6,uVar15);
          *(uint *)(lVar30 + uVar35 * 4) = uVar15;
          goto LAB_0013d58c;
        }
      }
      uVar19 = uVar35;
      if (*(char *)(lVar31 + uVar32) != '\0') goto LAB_0013ce7f;
      goto LAB_0013cea9;
    }
    if (*(char *)(lVar24 + uVar35) == '\0') {
      if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0013d045:
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_0013ac04;
      }
      uVar32 = uVar35;
      if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0013b4e2;
      if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013ac15;
      if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013ce05;
        uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_0013cb4d;
      }
    }
    else {
      uVar32 = uVar35;
      if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013aaaf;
      if (*(char *)(lVar29 + 3 + lVar31) != '\0') {
        if (*(char *)(lVar31 + lVar29) == '\0') goto LAB_0013b262;
LAB_0013ccd2:
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
          uVar15 = *(uint *)(lVar27 + lVar29 * 4);
          goto LAB_0013cce8;
        }
LAB_0013cc00:
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013d7f0;
        uVar15 = *(uint *)(lVar27 + lVar29 * 4);
        if (*(char *)(lVar18 + lVar29) == '\0') goto LAB_0013cce8;
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        goto LAB_0013d3c2;
      }
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        if (*(char *)(lVar31 + uVar35) == '\0') goto LAB_0013d08d;
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013d072;
        uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_0013bc8e;
      }
    }
    if (*(char *)(lVar29 + 4 + lVar31) != '\0') {
      if (*(char *)(lVar18 + 3 + lVar29) == '\0') {
        if (*(char *)(lVar31 + uVar35) != '\0') {
          if (*(char *)(lVar31 + lVar29) == '\0') {
            uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                 *(uint *)(lVar27 + 0x10 + lVar29 * 4));
            uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + lVar29 * 4));
LAB_0013d3b0:
            *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
            uVar35 = uVar35 & 0xffffffff;
          }
          else {
LAB_0013d18f:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar27 + 8 + lVar29 * 4)
                                  );
              uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
            }
            else {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                   *(uint *)(lVar30 + -8 + lVar29 * 4));
            }
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
          }
          goto LAB_0013c0d0;
        }
      }
      else if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_0013cfc9:
        iVar14 = (int)uVar35;
        uVar35 = uVar35 & 0xffffffff;
        lVar29 = (long)iVar14;
        if (*(char *)(lVar18 + -1 + lVar29) != '\0') goto LAB_0013cc5a;
        uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
        goto LAB_0013cfe3;
      }
      uVar15 = UFPC::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
      *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
      goto LAB_0013c0d0;
    }
    if (*(char *)(lVar31 + 2 + lVar29) != '\0') {
      uVar32 = uVar35;
      if (*(char *)(lVar31 + lVar29) == '\0') {
        uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
      }
      else {
LAB_0013d0b4:
        uVar35 = uVar32 & 0xffffffff;
        lVar29 = (long)(int)uVar32;
        uVar15 = *(uint *)(lVar27 + lVar29 * 4);
        if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
          uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        }
        else {
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        }
      }
      goto LAB_0013ac7d;
    }
LAB_0013d0cf:
    *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
    uVar35 = uVar35 & 0xffffffff;
LAB_0013be49:
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    if (local_190 <= (int)uVar35) {
      uVar32 = uVar35;
      if (local_190 < (int)uVar35) goto LAB_0013cb8d;
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar24 + uVar32) == '\0') {
        if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0013c811;
        if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_0013cea9;
      }
      if (*(char *)(lVar31 + 3 + lVar29) == '\0') goto LAB_0013cea9;
      goto LAB_0013bee5;
    }
    if (*(char *)(lVar24 + uVar35) != '\0') {
      if (*(char *)(lVar29 + 3 + lVar31) != '\0') {
        uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_0013d3c2;
      }
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_0013cc91;
      }
LAB_0013bf9c:
      if (*(char *)(lVar29 + 4 + lVar31) != '\0') {
        uVar15 = UFPC::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_0013c0d0;
      }
      *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_0013c4e8;
    }
    if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0013c01e:
      iVar14 = (int)uVar35;
      lVar29 = (long)iVar14;
      if (*(char *)(lVar29 + 1 + lVar24) == '\0') goto LAB_0013af14;
      if (*(char *)(lVar31 + 1 + lVar29) != '\0') goto LAB_0013ac1f;
      if (*(char *)(lVar29 + 2 + lVar31) == '\0') break;
      *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + 8 + lVar29 * 4);
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_0013c0d0;
    }
    if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0013c003;
    if (*(char *)(lVar31 + 3 + lVar29) == '\0') goto LAB_0013bf9c;
    uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
    *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
LAB_0013cb4d:
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    if (local_190 <= (int)uVar35) {
      if (local_190 < (int)uVar35) {
        uVar32 = uVar35 & 0xffffffff;
        goto LAB_0013cb8d;
      }
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar24 + uVar32) != '\0') goto LAB_0013d562;
      if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0013d845;
      if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0013d562;
      *(undefined4 *)(lVar30 + uVar32 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
      goto LAB_0013d58c;
    }
    if (*(char *)(lVar24 + uVar35) == '\0') {
      if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013ac04;
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
LAB_0013b52e:
        lVar29 = (long)(int)uVar35;
        uVar35 = lVar29 + 2;
        if ((int)uVar35 < local_190) {
          if (*(char *)(lVar24 + uVar35) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0013b321;
          }
          if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013b126;
LAB_0013b57e:
          lVar29 = (long)(int)uVar35;
          if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
            if (*(char *)(lVar31 + lVar29) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                     *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar29) == '\0') {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                       *(uint *)(lVar27 + lVar29 * 4));
                  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                else {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                       *(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            else {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                   *(uint *)(lVar30 + -8 + lVar29 * 4));
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            }
            goto LAB_0013d3c2;
          }
          if (*(char *)(lVar24 + 1 + lVar29) == '\0') {
            if (*(char *)(lVar31 + -1 + lVar29) != '\0') {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                   *(uint *)(lVar30 + -8 + lVar29 * 4));
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              goto LAB_0013cc91;
            }
LAB_0013ba6d:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar31 + lVar29) == '\0') {
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
              goto LAB_0013b230;
            }
            uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4))
            ;
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
LAB_0013bc8e:
            lVar29 = (long)(int)uVar35;
            uVar35 = lVar29 + 2;
            uVar15 = (uint)uVar35;
            if (local_190 <= (int)uVar15) {
              uVar32 = uVar35 & 0xffffffff;
              if (local_190 < (int)uVar15) {
                if (*(char *)(lVar24 + uVar32) == '\0') goto LAB_0013cf52;
                uVar19 = uVar35;
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013ab14;
              }
              else {
                if (*(char *)(lVar24 + uVar32) == '\0') {
                  if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0013d853;
                  if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_0013cf92;
                }
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013aa68;
                if (*(char *)(lVar31 + 3 + lVar29) != '\0') goto LAB_0013cd78;
              }
              uVar19 = uVar35;
              if (*(char *)(lVar31 + uVar32) != '\0') goto LAB_0013ce89;
              uVar12 = *(undefined4 *)(lVar30 + lVar29 * 4);
              goto LAB_0013c34f;
            }
            if (*(char *)(lVar24 + uVar35) == '\0') {
              if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0013d045;
              uVar32 = uVar35;
              if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0013b4e2;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013ac15;
              if (*(char *)(lVar31 + 3 + lVar29) != '\0') goto LAB_0013ce05;
LAB_0013bd8d:
              if (*(char *)(lVar29 + 4 + lVar31) == '\0') {
                uVar32 = uVar35;
                if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013d0b4;
                goto LAB_0013d0cf;
              }
              if (*(char *)(lVar18 + 3 + lVar29) != '\0') goto LAB_0013cfc9;
              if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013d18f;
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                   *(uint *)(lVar30 + lVar29 * 4));
              goto LAB_0013d3b0;
            }
            uVar32 = uVar35;
            if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013aaaf;
            if (*(char *)(lVar29 + 3 + lVar31) != '\0') goto LAB_0013ccd2;
            if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0013bd8d;
            if (*(char *)(lVar31 + uVar35) != '\0') {
LAB_0013d072:
              lVar29 = (long)(int)uVar35;
              uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              goto LAB_0013bc8e;
            }
LAB_0013d08d:
            *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
LAB_0013b230:
            lVar29 = (long)(int)uVar35;
            uVar35 = lVar29 + 2;
            if (local_190 <= (int)uVar35) {
              cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
              uVar32 = uVar35;
              if ((int)uVar35 <= local_190) {
                if (cVar1 == '\0') goto LAB_0013b756;
                goto LAB_0013b771;
              }
              if (cVar1 == '\0') goto LAB_0013cf52;
              uVar19 = uVar35;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013ab14;
              goto LAB_0013b792;
            }
            if (*(char *)(lVar24 + uVar35) != '\0') {
              uVar32 = uVar35;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_0013aaaf;
              if (*(char *)(lVar29 + 3 + lVar31) != '\0') goto LAB_0013b262;
              if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_0013ba6d;
LAB_0013b3a9:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar29 + 2 + lVar31) == '\0') {
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0013b412;
              }
              if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                if (*(char *)(lVar31 + lVar29) == '\0') {
                  uVar6 = *(uint *)(lVar27 + 8 + lVar29 * 4);
                  uVar15 = *(uint *)(lVar30 + -8 + lVar29 * 4);
                }
                else {
                  uVar6 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                      *(uint *)(lVar27 + 8 + lVar29 * 4));
                  uVar15 = *(uint *)(lVar30 + -8 + lVar29 * 4);
                }
                uVar15 = UFPC::Merge(uVar6,uVar15);
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
              else {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                     *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
              goto LAB_0013c0d0;
            }
LAB_0013b321:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar11 + lVar29) != '\0') {
              uVar32 = uVar35;
              if (*(char *)(lVar24 + 1 + lVar29) == '\0') goto LAB_0013b4e2;
              if (*(char *)(lVar11 + -1 + lVar29) == '\0') goto LAB_0013ac15;
LAB_0013b33c:
              lVar29 = (long)(int)uVar32;
              uVar35 = uVar32;
              if (*(char *)(lVar31 + 1 + lVar29) == '\0') goto LAB_0013b3a9;
              goto LAB_0013b34b;
            }
            uVar35 = uVar35 & 0xffffffff;
LAB_0013ac04:
            while( true ) {
              while( true ) {
                iVar14 = (int)uVar35;
                uVar35 = uVar35 & 0xffffffff;
                if (*(char *)(lVar24 + 1 + (long)iVar14) != '\0') goto LAB_0013ac15;
LAB_0013af14:
                lVar29 = (long)iVar14;
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') break;
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar15 = UFPC::length_;
                uVar6 = UFPC::length_ + 1;
                *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
                UFPC::length_ = uVar6;
                uVar32 = lVar29 + 2;
                if (local_190 <= (int)uVar32) {
                  uVar19 = uVar32 & 0xffffffff;
                  if (local_190 < (int)uVar32) {
                    if (*(char *)(lVar24 + uVar19) == '\0') goto LAB_0013cb9a;
                    goto LAB_0013b692;
                  }
                  if (*(char *)(lVar24 + uVar19) != '\0') {
                    uVar35 = uVar32 & 0xffffffff;
                    goto LAB_0013b63f;
                  }
                  uVar35 = uVar32;
                  if (*(char *)(lVar11 + uVar19) == '\0') goto LAB_0013d853;
                  if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0013b785;
                  *(uint *)(lVar30 + uVar19 * 4) = uVar15;
                  goto LAB_0013d58c;
                }
                if (*(char *)(lVar24 + uVar32) != '\0') {
                  uVar35 = uVar32 & 0xffffffff;
                  goto LAB_0013b57e;
                }
                if (*(char *)(lVar11 + uVar32) != '\0') {
                  if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0013b33c;
                  *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                  uVar35 = uVar32 & 0xffffffff;
                  goto LAB_0013b52e;
                }
                uVar35 = uVar32 & 0xffffffff;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = 0;
              uVar35 = lVar29 + 2;
              if (local_190 <= (int)uVar35) {
                cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
                uVar19 = uVar35;
                if ((int)uVar35 <= local_190) {
                  if (cVar1 != '\0') goto LAB_0013b71b;
                  goto LAB_0013b092;
                }
                if (cVar1 != '\0') goto LAB_0013b8cf;
                goto LAB_0013b00d;
              }
              if (*(char *)(lVar24 + uVar35) != '\0') break;
LAB_0013ab8d:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar11 + lVar29) != '\0') {
                if (*(char *)(lVar24 + 1 + lVar29) != '\0') goto LAB_0013ac15;
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar15 = UFPC::length_ + 1;
                *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
                UFPC::length_ = uVar15;
                goto LAB_0013b52e;
              }
            }
LAB_0013b126:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
              if ((*(char *)(lVar31 + lVar29) == '\0') && (*(char *)(lVar31 + -1 + lVar29) != '\0'))
              goto LAB_0013d7e2;
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
              goto LAB_0013d3c2;
            }
            if (*(char *)(lVar24 + 1 + lVar29) == '\0') {
              if (*(char *)(lVar31 + lVar29) == '\0') {
                if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar15 = UFPC::length_ + 1;
                  *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
                  UFPC::length_ = uVar15;
                }
                else {
                  *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + -8 + lVar29 * 4);
                }
                goto LAB_0013b230;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
              goto LAB_0013bc8e;
            }
            if (*(char *)(lVar31 + 2 + lVar29) == '\0') {
              if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013ac71;
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar15 = UFPC::length_;
                goto LAB_0013ada4;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + -8 + lVar29 * 4);
              goto LAB_0013be49;
            }
            if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013ac4d;
            if (*(char *)(lVar31 + -1 + lVar29) == '\0') goto LAB_0013b1a1;
LAB_0013db70:
            lVar29 = (long)(int)uVar35;
            if ((*(char *)(lVar18 + 1 + lVar29) == '\0') || (*(char *)(lVar18 + lVar29) == '\0')) {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                   *(uint *)(lVar27 + 8 + lVar29 * 4));
            }
            else {
              uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
            }
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            goto LAB_0013c0d0;
          }
          if (*(char *)(lVar29 + 2 + lVar31) != '\0') {
            if (*(char *)(lVar31 + lVar29) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                     *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                     *(uint *)(lVar27 + 8 + lVar29 * 4));
                uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar29) == '\0') {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                       *(uint *)(lVar27 + 8 + lVar29 * 4));
                  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                else {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                       *(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            else {
              if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                     *(uint *)(lVar27 + 8 + lVar29 * 4));
                uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
              }
              else {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                     *(uint *)(lVar30 + -8 + lVar29 * 4));
              }
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            }
            goto LAB_0013c0d0;
          }
          if (*(char *)(lVar31 + -1 + lVar29) != '\0') {
            uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                 *(uint *)(lVar30 + -8 + lVar29 * 4));
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            goto LAB_0013c4e8;
          }
LAB_0013b412:
          lVar29 = (long)(int)uVar35;
          if (*(char *)(lVar31 + lVar29) == '\0') {
            *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
            goto LAB_0013be49;
          }
          uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
          goto LAB_0013ac7d;
        }
        cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
        uVar19 = uVar35;
        if (local_190 < (int)uVar35) {
          if (cVar1 == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0013cf52;
          }
          uVar32 = uVar35 & 0xffffffff;
          if (*(char *)(lVar11 + 1 + lVar29) == '\0') {
LAB_0013b8cf:
            uVar35 = (ulong)(int)uVar19;
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013ab21;
            if (*(char *)(lVar31 + -1 + uVar35) == '\0') goto LAB_0013b01a;
            uVar12 = *(undefined4 *)(lVar27 + -8 + uVar35 * 4);
            goto LAB_0013d583;
          }
LAB_0013b692:
          uVar35 = (ulong)(int)uVar32;
          if (*(char *)(lVar31 + -1 + uVar35) == '\0') {
LAB_0013b792:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_0013b79b;
            uVar12 = *(undefined4 *)(lVar30 + -8 + uVar35 * 4);
            goto LAB_0013d578;
          }
          uVar6 = *(uint *)(lVar27 + -8 + uVar35 * 4);
        }
        else {
          if (cVar1 != '\0') {
            if (*(char *)(lVar11 + 1 + lVar29) == '\0') {
LAB_0013b71b:
              uVar15 = (uint)uVar19;
              uVar35 = (ulong)(int)uVar15;
              if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_0013b8cf;
              if ((*(char *)(lVar31 + uVar35) != '\0') || (*(char *)(lVar31 + -1 + uVar35) == '\0'))
              goto LAB_0013ab21;
              goto LAB_0013d9a2;
            }
LAB_0013b63f:
            lVar24 = (long)(int)uVar35;
            uVar32 = uVar35 & 0xffffffff;
            if (*(char *)(lVar31 + 1 + lVar24) == '\0') goto LAB_0013b692;
            if (*(char *)(lVar31 + lVar24) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar24) == '\0') {
                uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar24 * 4),
                                     *(uint *)(lVar30 + -8 + lVar24 * 4));
                *(uint *)(lVar30 + lVar24 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar24) == '\0') {
                  uVar15 = UFPC::Merge(*(uint *)(lVar27 + -8 + lVar24 * 4),
                                       *(uint *)(lVar27 + lVar24 * 4));
                  uVar6 = *(uint *)(lVar30 + -8 + lVar24 * 4);
                }
                else {
                  uVar15 = *(uint *)(lVar27 + lVar24 * 4);
                  uVar6 = *(uint *)(lVar30 + -8 + lVar24 * 4);
                }
                uVar15 = UFPC::Merge(uVar15,uVar6);
                *(uint *)(lVar30 + lVar24 * 4) = uVar15;
              }
            }
            else {
              uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar24 * 4),
                                   *(uint *)(lVar30 + -8 + lVar24 * 4));
              *(uint *)(lVar30 + lVar24 * 4) = uVar15;
            }
            goto LAB_0013d58c;
          }
          uVar35 = uVar35 & 0xffffffff;
LAB_0013b756:
          iVar14 = (int)uVar35;
          if (*(char *)(lVar11 + (uVar35 & 0xffffffff)) == '\0') goto LAB_0013d853;
          uVar32 = uVar35;
          if (*(char *)(lVar24 + 1 + (long)iVar14) == '\0') goto LAB_0013cf5f;
LAB_0013b771:
          uVar15 = (uint)uVar32;
          if (*(char *)(lVar11 + -1 + (long)(int)uVar15) == '\0') goto LAB_0013aa68;
LAB_0013b785:
          uVar35 = (ulong)(int)uVar32;
          if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_0013b792;
LAB_0013b79b:
          uVar6 = *(uint *)(lVar27 + uVar35 * 4);
        }
        uVar15 = *(uint *)(lVar30 + -8 + uVar35 * 4);
        goto LAB_0013b7a6;
      }
LAB_0013d717:
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar31 + 1 + (long)(int)uVar35) != '\0') goto LAB_0013d728;
      goto LAB_0013cc2f;
    }
LAB_0013cbee:
    lVar29 = (long)(int)uVar35;
    if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_0013cc00;
    }
    if (*(char *)(lVar24 + 1 + lVar29) != '\0') {
LAB_0013cc2f:
      lVar29 = (long)(int)uVar35;
      if (*(char *)(lVar31 + 2 + lVar29) != '\0') goto LAB_0013cc42;
      *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
      goto LAB_0013c4e8;
    }
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
  } while( true );
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar15 = UFPC::length_ + 1;
  *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
  UFPC::length_ = uVar15;
  uVar35 = uVar35 & 0xffffffff;
  goto LAB_0013be49;
LAB_0013ce05:
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
LAB_0013b34b:
    uVar15 = UFPC::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
    uVar35 = uVar32;
  }
  else {
LAB_0013d728:
    uVar35 = uVar32;
    lVar29 = (long)(int)uVar35;
    if (*(char *)(lVar31 + lVar29) == '\0') {
      uVar15 = *(uint *)(lVar27 + lVar29 * 4);
      if (*(char *)(lVar18 + lVar29) == '\0') {
        uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
      }
      else {
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
      }
      goto LAB_0013cb4d;
    }
    uVar15 = *(uint *)(lVar27 + lVar29 * 4);
  }
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0013cb4d;
LAB_0013b4e2:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar11 + -1 + lVar29) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar15 = UFPC::length_ + 1;
    *(uint *)(lVar30 + lVar29 * 4) = UFPC::length_;
    UFPC::length_ = uVar15;
  }
  else {
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
  }
  goto LAB_0013b52e;
LAB_0013ac15:
  lVar29 = (long)(int)uVar35;
  uVar32 = uVar35;
  if (*(char *)(lVar31 + 1 + lVar29) == '\0') goto LAB_0013ac33;
LAB_0013ac1f:
  *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
  goto LAB_0013cb4d;
LAB_0013ac33:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar31 + 2 + lVar29) != '\0') {
    if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0013ac4d;
LAB_0013b1a1:
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + 8 + lVar29 * 4);
    goto LAB_0013c0d0;
  }
  if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_0013ac71:
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
    goto LAB_0013ac7d;
  }
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar15 = UFPC::length_;
LAB_0013ada4:
  UFPC::length_ = uVar15 + 1;
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0013be49;
LAB_0013cc42:
  lVar29 = (long)(int)uVar35;
  if (*(char *)(lVar18 + 1 + lVar29) != '\0') goto LAB_0013cc5a;
  uVar15 = UFPC::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0013c0d0;
LAB_0013cc5a:
  lVar29 = (long)(int)uVar35;
  if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_0013ac60:
    uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
    goto LAB_0013d01f;
  }
  cVar1 = *(char *)(lVar18 + lVar29);
  goto LAB_0013cc70;
LAB_0013c6e1:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  cVar1 = *(char *)(lVar18 + -1 + lVar29);
LAB_0013cc70:
  uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
  if (cVar1 != '\0') {
    *(uint *)(lVar30 + lVar29 * 4) = uVar15;
    goto LAB_0013c0d0;
  }
LAB_0013cfe3:
  uVar15 = UFPC::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
LAB_0013d01f:
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0013c0d0;
code_r0x0013e7c4:
  *(undefined4 *)(lVar25 + lVar26 * 4) = *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
  lVar8 = lVar11 + lVar26;
  lVar26 = lVar26 + 2;
  if (lVar31 <= lVar8 + 2) {
    uVar15 = iVar14 + (int)lVar26 + 2;
    iVar14 = iVar14 + (int)lVar26;
    goto LAB_0013ea63;
  }
  goto LAB_0013e79f;
LAB_0013e20e:
  *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + 8 + uVar34 * 4);
  uVar34 = uVar35;
  goto LAB_0013e2b5;
LAB_0013e002:
  uVar15 = *(uint *)(lVar33 + lVar11 * 4);
  uVar6 = *(uint *)(lVar33 + 8 + lVar11 * 4);
  goto LAB_0013e00c;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}